

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_manager_worker.c
# Opt level: O0

apx_error_t
apx_fileManagerWorker_prepare_send_open_file_request(apx_fileManagerWorker_t *self,uint32_t address)

{
  undefined4 local_40;
  uint32_t uStack_3c;
  apx_command_t cmd;
  adt_buf_err_t rc;
  uint32_t address_local;
  apx_fileManagerWorker_t *self_local;
  
  if (self == (apx_fileManagerWorker_t *)0x0) {
    self_local._4_4_ = 1;
  }
  else {
    cmd.cmd_type = '\0';
    cmd._1_3_ = 0;
    cmd.data1 = 0;
    cmd.data2 = 0;
    cmd._12_4_ = 0;
    cmd.data3.ptr = (void *)0x0;
    _local_40 = CONCAT44(address,5);
    cmd.data4._4_4_ = address;
    pthread_spin_lock(&self->queue_lock);
    cmd.data4._3_1_ = adt_rbfh_insert(&self->queue,(uint8_t *)&local_40);
    pthread_spin_unlock(&self->queue_lock);
    sem_post((sem_t *)&self->semaphore);
    self_local._4_4_ = apx_fileManagerWorker_process_ringbuffer_error(cmd.data4._3_1_);
  }
  return self_local._4_4_;
}

Assistant:

apx_error_t apx_fileManagerWorker_prepare_send_open_file_request(apx_fileManagerWorker_t* self, uint32_t address)
{
   if (self != NULL)
   {
      adt_buf_err_t rc;
      apx_command_t cmd = { APX_CMD_OPEN_REMOTE_FILE, 0, 0, {0}, 0 };
      cmd.data1 = address;
      SPINLOCK_ENTER(self->queue_lock);
      rc = adt_rbfh_insert(&self->queue, (const uint8_t*)&cmd);
      SPINLOCK_LEAVE(self->queue_lock);
#ifndef UNIT_TEST
      SEMAPHORE_POST(self->semaphore);
#endif
      return apx_fileManagerWorker_process_ringbuffer_error(rc);
   }
   return APX_INVALID_ARGUMENT_ERROR;
}